

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_8.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  undefined8 *puVar3;
  int iVar4;
  char *pcVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  bool bVar11;
  __m128i *palVar12;
  __m128i *palVar13;
  int iVar14;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar15;
  __m128i *palVar16;
  __m128i *palVar17;
  __m128i *b_00;
  __m128i *palVar18;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *palVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  __m128i *palVar25;
  int iVar26;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar27;
  parasail_result_t *ppVar28;
  parasail_result_t *ppVar29;
  int iVar30;
  __m128i *ptr;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  __m128i *palVar34;
  __m128i *ptr_00;
  __m128i *palVar35;
  __m128i *ptr_01;
  __m128i *palVar36;
  __m128i *ptr_02;
  __m128i *palVar37;
  __m128i *ptr_03;
  char cVar38;
  char cVar39;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  char cVar63;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  char cVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar77 [16];
  byte bVar78;
  char cVar79;
  char cVar80;
  byte bVar83;
  char cVar84;
  char cVar85;
  byte bVar86;
  char cVar87;
  char cVar88;
  byte bVar89;
  char cVar90;
  char cVar91;
  byte bVar92;
  char cVar93;
  char cVar94;
  byte bVar95;
  char cVar96;
  char cVar97;
  byte bVar98;
  char cVar99;
  char cVar100;
  byte bVar101;
  char cVar102;
  char cVar103;
  byte bVar104;
  char cVar105;
  char cVar106;
  byte bVar107;
  char cVar108;
  char cVar109;
  byte bVar110;
  char cVar111;
  char cVar112;
  byte bVar113;
  char cVar114;
  char cVar115;
  byte bVar116;
  char cVar117;
  char cVar118;
  byte bVar119;
  char cVar120;
  char cVar121;
  byte bVar122;
  char cVar123;
  char cVar124;
  byte bVar125;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  char cVar126;
  char cVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  ulong uVar132;
  undefined1 auVar133 [16];
  byte bVar135;
  byte bVar136;
  byte bVar137;
  byte bVar138;
  byte bVar139;
  byte bVar140;
  byte bVar141;
  byte bVar142;
  undefined1 auVar134 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  uint local_1e8;
  int local_1e4;
  __m128i *local_1e0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1b0;
  __m128i *local_1a8;
  undefined8 uStack_1a0;
  char local_198;
  __m128i *local_178;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_78 [16];
  
  pcVar5 = profile->s1;
  ppVar6 = profile->matrix;
  result = parasail_sw_striped_profile_sse41_128_8(profile,s2,s2Len,open,gap);
  iVar14 = parasail_result_is_saturated(result);
  if (iVar14 != 0) {
    return result;
  }
  iVar14 = result->end_query;
  iVar4 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_8(pcVar5,iVar14 + 1,ppVar6);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_sse41_128_8_cold_8();
  }
  else {
    pvVar7 = (profile_00->profile8).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sw_stats_striped_profile_sse41_128_8_cold_7();
    }
    else {
      ppVar6 = profile_00->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_sse41_128_8_cold_6();
      }
      else {
        uVar31 = profile_00->s1Len;
        uVar24 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          parasail_sw_stats_striped_profile_sse41_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_sse41_128_8_cold_4();
        }
        else if (iVar4 < 0) {
          parasail_sw_stats_striped_profile_sse41_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_sse41_128_8_cold_2();
        }
        else {
          if (-1 < gap) {
            pvVar8 = (profile_00->profile8).matches;
            pvVar9 = (profile_00->profile8).similar;
            iVar22 = ppVar6->max;
            result_00 = parasail_result_new_stats();
            ppVar29 = (parasail_result_t *)0x0;
            if (result_00 != (parasail_result_t *)0x0) {
              uVar27 = uVar24 + 0xf >> 4;
              result_00->flag = result_00->flag | 0x10110804;
              b = parasail_memalign___m128i(0x10,uVar27);
              palVar15 = parasail_memalign___m128i(0x10,uVar27);
              palVar16 = parasail_memalign___m128i(0x10,uVar27);
              palVar17 = parasail_memalign___m128i(0x10,uVar27);
              b_00 = parasail_memalign___m128i(0x10,uVar27);
              palVar18 = parasail_memalign___m128i(0x10,uVar27);
              b_01 = parasail_memalign___m128i(0x10,uVar27);
              local_1d8 = parasail_memalign___m128i(0x10,uVar27);
              b_02 = parasail_memalign___m128i(0x10,uVar27);
              b_03 = parasail_memalign___m128i(0x10,uVar27);
              b_04 = parasail_memalign___m128i(0x10,uVar27);
              b_05 = parasail_memalign___m128i(0x10,uVar27);
              palVar19 = parasail_memalign___m128i(0x10,uVar27);
              local_1d0 = parasail_memalign___m128i(0x10,uVar27);
              local_1e0 = parasail_memalign___m128i(0x10,uVar27);
              local_1b0 = parasail_memalign___m128i(0x10,uVar27);
              ppVar28 = (parasail_result_t *)0x0;
              ppVar29 = (parasail_result_t *)0x0;
              if ((((((b != (__m128i *)0x0) && (palVar15 != (__m128i *)0x0)) &&
                    (ppVar29 = ppVar28, palVar16 != (__m128i *)0x0)) &&
                   ((palVar17 != (__m128i *)0x0 && (b_00 != (__m128i *)0x0)))) &&
                  (((palVar18 != (__m128i *)0x0 &&
                    ((b_01 != (__m128i *)0x0 && (local_1d8 != (__m128i *)0x0)))) &&
                   (b_02 != (__m128i *)0x0)))) &&
                 ((((b_03 != (__m128i *)0x0 && (b_04 != (__m128i *)0x0)) && (b_05 != (__m128i *)0x0)
                   ) && (((palVar19 != (__m128i *)0x0 && (local_1d0 != (__m128i *)0x0)) &&
                         ((local_1e0 != (__m128i *)0x0 && (local_1b0 != (__m128i *)0x0)))))))) {
                auVar58 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                auVar59 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                c[1] = (longlong)b_04;
                c[0] = uVar27;
                palVar25 = b_03;
                parasail_memset___m128i(b,c,(size_t)b_03);
                c_00[1] = extraout_RDX;
                c_00[0] = uVar27;
                parasail_memset___m128i(palVar16,c_00,(size_t)palVar25);
                c_01[1] = extraout_RDX_00;
                c_01[0] = uVar27;
                parasail_memset___m128i(b_00,c_01,(size_t)palVar25);
                c_02[1] = extraout_RDX_01;
                c_02[0] = uVar27;
                parasail_memset___m128i(b_01,c_02,(size_t)palVar25);
                c_03[1] = extraout_RDX_02;
                c_03[0] = uVar27;
                parasail_memset___m128i(b_02,c_03,(size_t)palVar25);
                c_04[1] = extraout_RDX_03;
                c_04[0] = uVar27;
                parasail_memset___m128i(b_03,c_04,(size_t)palVar25);
                c_05[1] = extraout_RDX_04;
                c_05[0] = uVar27;
                parasail_memset___m128i(b_04,c_05,(size_t)palVar25);
                c_06[1] = extraout_RDX_05;
                c_06[0] = uVar27;
                parasail_memset___m128i(b_05,c_06,(size_t)palVar25);
                uVar10 = (uint)uVar27;
                uVar21 = uVar10 - 1;
                local_198 = (char)iVar22;
                local_1e8 = 0x80;
                uVar32 = 0;
                local_1e4 = 0;
                local_78 = _DAT_008d0e60;
                auVar144 = _DAT_008d0e60;
                auVar134 = _DAT_008d0e60;
                auVar130 = _DAT_008d0e60;
                do {
                  palVar37 = b_01;
                  palVar36 = b_00;
                  palVar35 = palVar16;
                  palVar34 = b;
                  lVar33 = (long)(int)(ppVar6->mapper[(byte)s2[uVar32]] * uVar10) * 0x10;
                  iVar22 = (int)uVar32 + -2;
                  b_00 = palVar18;
                  palVar25 = local_1d0;
                  palVar16 = local_1b0;
                  b_01 = local_1d8;
                  if (local_1e4 == iVar22) {
                    b_00 = local_1e0;
                    palVar25 = palVar17;
                    palVar16 = local_1d8;
                    b_01 = local_1b0;
                  }
                  local_1b0 = palVar16;
                  b = palVar15;
                  palVar16 = palVar17;
                  if (local_1e4 == iVar22) {
                    b = palVar19;
                    palVar16 = local_1d0;
                  }
                  uVar132 = palVar37[uVar21][0];
                  auVar131._8_8_ = palVar37[uVar21][1] << 8 | uVar132 >> 0x38;
                  auVar131._0_8_ = uVar132 << 8 | 0x80;
                  uVar132 = palVar36[uVar21][0];
                  auVar82._8_8_ = palVar36[uVar21][1] << 8 | uVar132 >> 0x38;
                  auVar82._0_8_ = uVar132 << 8 | 0x80;
                  uVar132 = palVar35[uVar21][0];
                  auVar129._8_8_ = palVar35[uVar21][1] << 8 | uVar132 >> 0x38;
                  auVar129._0_8_ = uVar132 << 8 | 0x80;
                  uVar132 = palVar34[uVar21][0];
                  auVar64._8_8_ = palVar34[uVar21][1] << 8 | uVar132 >> 0x38;
                  auVar64._0_8_ = uVar132 << 8 | 0x80;
                  lVar20 = 0;
                  auVar133 = auVar144;
                  auVar145 = auVar130;
                  auVar146 = _DAT_008d1340;
                  auVar66 = auVar144;
                  auVar150 = auVar144;
                  do {
                    pauVar1 = (undefined1 (*) [16])((long)*b_02 + lVar20);
                    cVar39 = (*pauVar1)[0];
                    cVar38 = (*pauVar1)[1];
                    cVar43 = (*pauVar1)[2];
                    cVar44 = (*pauVar1)[3];
                    cVar45 = (*pauVar1)[4];
                    cVar46 = (*pauVar1)[5];
                    cVar47 = (*pauVar1)[6];
                    cVar48 = (*pauVar1)[7];
                    cVar49 = (*pauVar1)[8];
                    cVar50 = (*pauVar1)[9];
                    cVar51 = (*pauVar1)[10];
                    cVar52 = (*pauVar1)[0xb];
                    cVar53 = (*pauVar1)[0xc];
                    cVar54 = (*pauVar1)[0xd];
                    cVar55 = (*pauVar1)[0xe];
                    cVar56 = (*pauVar1)[0xf];
                    auVar143 = *pauVar1;
                    auVar144 = *(undefined1 (*) [16])((long)*b_03 + lVar20);
                    auVar40 = *(undefined1 (*) [16])((long)*b_04 + lVar20);
                    pauVar1 = (undefined1 (*) [16])((long)*b_05 + lVar20);
                    auVar67 = *pauVar1;
                    auVar130 = *pauVar1;
                    auVar64 = paddsb(auVar64,*(undefined1 (*) [16])((long)pvVar7 + lVar20 + lVar33))
                    ;
                    bVar68 = auVar64[0];
                    bVar78 = ((char)bVar68 < cVar39) * cVar39 | ((char)bVar68 >= cVar39) * bVar68;
                    bVar69 = auVar64[1];
                    bVar83 = ((char)bVar69 < cVar38) * cVar38 | ((char)bVar69 >= cVar38) * bVar69;
                    bVar70 = auVar64[2];
                    bVar86 = ((char)bVar70 < cVar43) * cVar43 | ((char)bVar70 >= cVar43) * bVar70;
                    bVar71 = auVar64[3];
                    bVar89 = ((char)bVar71 < cVar44) * cVar44 | ((char)bVar71 >= cVar44) * bVar71;
                    bVar72 = auVar64[4];
                    bVar92 = ((char)bVar72 < cVar45) * cVar45 | ((char)bVar72 >= cVar45) * bVar72;
                    bVar73 = auVar64[5];
                    bVar95 = ((char)bVar73 < cVar46) * cVar46 | ((char)bVar73 >= cVar46) * bVar73;
                    bVar74 = auVar64[6];
                    bVar98 = ((char)bVar74 < cVar47) * cVar47 | ((char)bVar74 >= cVar47) * bVar74;
                    bVar75 = auVar64[7];
                    bVar101 = ((char)bVar75 < cVar48) * cVar48 | ((char)bVar75 >= cVar48) * bVar75;
                    bVar135 = auVar64[8];
                    bVar104 = ((char)bVar135 < cVar49) * cVar49 |
                              ((char)bVar135 >= cVar49) * bVar135;
                    bVar136 = auVar64[9];
                    bVar107 = ((char)bVar136 < cVar50) * cVar50 |
                              ((char)bVar136 >= cVar50) * bVar136;
                    bVar137 = auVar64[10];
                    bVar110 = ((char)bVar137 < cVar51) * cVar51 |
                              ((char)bVar137 >= cVar51) * bVar137;
                    bVar138 = auVar64[0xb];
                    bVar113 = ((char)bVar138 < cVar52) * cVar52 |
                              ((char)bVar138 >= cVar52) * bVar138;
                    bVar139 = auVar64[0xc];
                    bVar116 = ((char)bVar139 < cVar53) * cVar53 |
                              ((char)bVar139 >= cVar53) * bVar139;
                    bVar140 = auVar64[0xd];
                    bVar119 = ((char)bVar140 < cVar54) * cVar54 |
                              ((char)bVar140 >= cVar54) * bVar140;
                    bVar141 = auVar64[0xe];
                    bVar142 = auVar64[0xf];
                    bVar122 = ((char)bVar141 < cVar55) * cVar55 |
                              ((char)bVar141 >= cVar55) * bVar141;
                    bVar125 = ((char)bVar142 < cVar56) * cVar56 |
                              ((char)bVar142 >= cVar56) * bVar142;
                    cVar39 = auVar150[0];
                    auVar60[0] = ((char)bVar78 < cVar39) * cVar39 |
                                 ((char)bVar78 >= cVar39) * bVar78;
                    cVar38 = auVar150[1];
                    auVar60[1] = ((char)bVar83 < cVar38) * cVar38 |
                                 ((char)bVar83 >= cVar38) * bVar83;
                    cVar43 = auVar150[2];
                    auVar60[2] = ((char)bVar86 < cVar43) * cVar43 |
                                 ((char)bVar86 >= cVar43) * bVar86;
                    cVar44 = auVar150[3];
                    auVar60[3] = ((char)bVar89 < cVar44) * cVar44 |
                                 ((char)bVar89 >= cVar44) * bVar89;
                    cVar45 = auVar150[4];
                    auVar60[4] = ((char)bVar92 < cVar45) * cVar45 |
                                 ((char)bVar92 >= cVar45) * bVar92;
                    cVar46 = auVar150[5];
                    auVar60[5] = ((char)bVar95 < cVar46) * cVar46 |
                                 ((char)bVar95 >= cVar46) * bVar95;
                    cVar47 = auVar150[6];
                    auVar60[6] = ((char)bVar98 < cVar47) * cVar47 |
                                 ((char)bVar98 >= cVar47) * bVar98;
                    cVar48 = auVar150[7];
                    auVar60[7] = ((char)bVar101 < cVar48) * cVar48 |
                                 ((char)bVar101 >= cVar48) * bVar101;
                    cVar49 = auVar150[8];
                    auVar60[8] = ((char)bVar104 < cVar49) * cVar49 |
                                 ((char)bVar104 >= cVar49) * bVar104;
                    cVar50 = auVar150[9];
                    auVar60[9] = ((char)bVar107 < cVar50) * cVar50 |
                                 ((char)bVar107 >= cVar50) * bVar107;
                    cVar51 = auVar150[10];
                    auVar60[10] = ((char)bVar110 < cVar51) * cVar51 |
                                  ((char)bVar110 >= cVar51) * bVar110;
                    cVar52 = auVar150[0xb];
                    auVar60[0xb] = ((char)bVar113 < cVar52) * cVar52 |
                                   ((char)bVar113 >= cVar52) * bVar113;
                    cVar53 = auVar150[0xc];
                    auVar60[0xc] = ((char)bVar116 < cVar53) * cVar53 |
                                   ((char)bVar116 >= cVar53) * bVar116;
                    cVar54 = auVar150[0xd];
                    auVar60[0xd] = ((char)bVar119 < cVar54) * cVar54 |
                                   ((char)bVar119 >= cVar54) * bVar119;
                    cVar55 = auVar150[0xe];
                    auVar60[0xe] = ((char)bVar122 < cVar55) * cVar55 |
                                   ((char)bVar122 >= cVar55) * bVar122;
                    cVar56 = auVar150[0xf];
                    auVar60[0xf] = ((char)bVar125 < cVar56) * cVar56 |
                                   ((char)bVar125 >= cVar56) * bVar125;
                    *(undefined1 (*) [16])((long)*b + lVar20) = auVar60;
                    auVar77 = _DAT_008d0e60;
                    auVar81[0] = -(cVar39 < (char)bVar78);
                    auVar81[1] = -(cVar38 < (char)bVar83);
                    auVar81[2] = -(cVar43 < (char)bVar86);
                    auVar81[3] = -(cVar44 < (char)bVar89);
                    auVar81[4] = -(cVar45 < (char)bVar92);
                    auVar81[5] = -(cVar46 < (char)bVar95);
                    auVar81[6] = -(cVar47 < (char)bVar98);
                    auVar81[7] = -(cVar48 < (char)bVar101);
                    auVar81[8] = -(cVar49 < (char)bVar104);
                    auVar81[9] = -(cVar50 < (char)bVar107);
                    auVar81[10] = -(cVar51 < (char)bVar110);
                    auVar81[0xb] = -(cVar52 < (char)bVar113);
                    auVar81[0xc] = -(cVar53 < (char)bVar116);
                    auVar81[0xd] = -(cVar54 < (char)bVar119);
                    auVar81[0xe] = -(cVar55 < (char)bVar122);
                    auVar81[0xf] = -(cVar56 < (char)bVar125);
                    auVar147 = pblendvb(auVar133,auVar144,auVar81);
                    auVar64 = paddsb(auVar129,*(undefined1 (*) [16])((long)pvVar8 + lVar20 + lVar33)
                                    );
                    auVar65[0] = -(bVar68 == auVar60[0]);
                    auVar65[1] = -(bVar69 == auVar60[1]);
                    auVar65[2] = -(bVar70 == auVar60[2]);
                    auVar65[3] = -(bVar71 == auVar60[3]);
                    auVar65[4] = -(bVar72 == auVar60[4]);
                    auVar65[5] = -(bVar73 == auVar60[5]);
                    auVar65[6] = -(bVar74 == auVar60[6]);
                    auVar65[7] = -(bVar75 == auVar60[7]);
                    auVar65[8] = -(bVar135 == auVar60[8]);
                    auVar65[9] = -(bVar136 == auVar60[9]);
                    auVar65[10] = -(bVar137 == auVar60[10]);
                    auVar65[0xb] = -(bVar138 == auVar60[0xb]);
                    auVar65[0xc] = -(bVar139 == auVar60[0xc]);
                    auVar65[0xd] = -(bVar140 == auVar60[0xd]);
                    auVar65[0xe] = -(bVar141 == auVar60[0xe]);
                    auVar65[0xf] = -(bVar142 == auVar60[0xf]);
                    auVar64 = pblendvb(auVar147,auVar64,auVar65);
                    auVar147[0] = -(auVar60[0] == DAT_008d0e60);
                    auVar147[1] = -(auVar60[1] == DAT_008d0e60._1_1_);
                    auVar147[2] = -(auVar60[2] == DAT_008d0e60._2_1_);
                    auVar147[3] = -(auVar60[3] == DAT_008d0e60._3_1_);
                    auVar147[4] = -(auVar60[4] == DAT_008d0e60._4_1_);
                    auVar147[5] = -(auVar60[5] == DAT_008d0e60._5_1_);
                    auVar147[6] = -(auVar60[6] == DAT_008d0e60._6_1_);
                    auVar147[7] = -(auVar60[7] == DAT_008d0e60._7_1_);
                    auVar147[8] = -(auVar60[8] == DAT_008d0e60._8_1_);
                    auVar147[9] = -(auVar60[9] == DAT_008d0e60._9_1_);
                    auVar147[10] = -(auVar60[10] == DAT_008d0e60._10_1_);
                    auVar147[0xb] = -(auVar60[0xb] == DAT_008d0e60._11_1_);
                    auVar147[0xc] = -(auVar60[0xc] == DAT_008d0e60._12_1_);
                    auVar147[0xd] = -(auVar60[0xd] == DAT_008d0e60._13_1_);
                    auVar147[0xe] = -(auVar60[0xe] == DAT_008d0e60._14_1_);
                    auVar147[0xf] = -(auVar60[0xf] == DAT_008d0e60._15_1_);
                    auVar148 = pblendvb(auVar64,_DAT_008d0e60,auVar147);
                    *(undefined1 (*) [16])((long)*palVar16 + lVar20) = auVar148;
                    auVar64 = pblendvb(auVar66,auVar40,auVar81);
                    auVar129 = paddsb(auVar82,*(undefined1 (*) [16])((long)pvVar9 + lVar20 + lVar33)
                                     );
                    auVar64 = pblendvb(auVar64,auVar129,auVar65);
                    auVar128 = pblendvb(auVar64,auVar77,auVar147);
                    *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar128;
                    auVar64 = _DAT_008d0c20;
                    auVar130 = pblendvb(auVar146,auVar130,auVar81);
                    auVar129 = paddsb(auVar131,_DAT_008d0c20);
                    auVar130 = pblendvb(auVar130,auVar129,auVar65);
                    auVar131 = pblendvb(auVar130,auVar77,auVar147);
                    *(undefined1 (*) [16])((long)*b_01 + lVar20) = auVar131;
                    cVar39 = auVar131[0];
                    cVar38 = auVar128[0];
                    bVar104 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[1];
                    cVar38 = auVar128[1];
                    bVar135 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[2];
                    cVar38 = auVar128[2];
                    bVar107 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[3];
                    cVar38 = auVar128[3];
                    bVar136 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[4];
                    cVar38 = auVar128[4];
                    bVar110 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[5];
                    cVar38 = auVar128[5];
                    bVar137 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[6];
                    cVar38 = auVar128[6];
                    bVar113 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[7];
                    cVar38 = auVar128[7];
                    bVar138 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[8];
                    cVar38 = auVar128[8];
                    bVar116 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[9];
                    cVar38 = auVar128[9];
                    bVar139 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[10];
                    cVar38 = auVar128[10];
                    bVar119 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[0xb];
                    cVar38 = auVar128[0xb];
                    bVar140 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[0xc];
                    cVar38 = auVar128[0xc];
                    bVar122 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[0xd];
                    cVar38 = auVar128[0xd];
                    bVar141 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[0xe];
                    cVar38 = auVar128[0xe];
                    cVar43 = auVar128[0xf];
                    bVar142 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                    cVar39 = auVar131[0xf];
                    bVar125 = (cVar43 < cVar39) * cVar39 | (cVar43 >= cVar39) * cVar43;
                    cVar39 = auVar145[0];
                    auVar130[0] = (cVar39 < (char)auVar60[0]) * auVar60[0] |
                                  (cVar39 >= (char)auVar60[0]) * cVar39;
                    cVar39 = auVar145[1];
                    auVar130[1] = (cVar39 < (char)auVar60[1]) * auVar60[1] |
                                  (cVar39 >= (char)auVar60[1]) * cVar39;
                    cVar39 = auVar145[2];
                    auVar130[2] = (cVar39 < (char)auVar60[2]) * auVar60[2] |
                                  (cVar39 >= (char)auVar60[2]) * cVar39;
                    cVar39 = auVar145[3];
                    auVar130[3] = (cVar39 < (char)auVar60[3]) * auVar60[3] |
                                  (cVar39 >= (char)auVar60[3]) * cVar39;
                    cVar39 = auVar145[4];
                    auVar130[4] = (cVar39 < (char)auVar60[4]) * auVar60[4] |
                                  (cVar39 >= (char)auVar60[4]) * cVar39;
                    cVar39 = auVar145[5];
                    auVar130[5] = (cVar39 < (char)auVar60[5]) * auVar60[5] |
                                  (cVar39 >= (char)auVar60[5]) * cVar39;
                    cVar39 = auVar145[6];
                    auVar130[6] = (cVar39 < (char)auVar60[6]) * auVar60[6] |
                                  (cVar39 >= (char)auVar60[6]) * cVar39;
                    cVar39 = auVar145[7];
                    auVar130[7] = (cVar39 < (char)auVar60[7]) * auVar60[7] |
                                  (cVar39 >= (char)auVar60[7]) * cVar39;
                    cVar39 = auVar145[8];
                    auVar130[8] = (cVar39 < (char)auVar60[8]) * auVar60[8] |
                                  (cVar39 >= (char)auVar60[8]) * cVar39;
                    cVar39 = auVar145[9];
                    auVar130[9] = (cVar39 < (char)auVar60[9]) * auVar60[9] |
                                  (cVar39 >= (char)auVar60[9]) * cVar39;
                    cVar39 = auVar145[10];
                    auVar130[10] = (cVar39 < (char)auVar60[10]) * auVar60[10] |
                                   (cVar39 >= (char)auVar60[10]) * cVar39;
                    cVar39 = auVar145[0xb];
                    auVar130[0xb] =
                         (cVar39 < (char)auVar60[0xb]) * auVar60[0xb] |
                         (cVar39 >= (char)auVar60[0xb]) * cVar39;
                    cVar39 = auVar145[0xc];
                    auVar130[0xc] =
                         (cVar39 < (char)auVar60[0xc]) * auVar60[0xc] |
                         (cVar39 >= (char)auVar60[0xc]) * cVar39;
                    cVar39 = auVar145[0xd];
                    auVar130[0xd] =
                         (cVar39 < (char)auVar60[0xd]) * auVar60[0xd] |
                         (cVar39 >= (char)auVar60[0xd]) * cVar39;
                    cVar39 = auVar145[0xe];
                    cVar38 = auVar145[0xf];
                    auVar130[0xe] =
                         (cVar39 < (char)auVar60[0xe]) * auVar60[0xe] |
                         (cVar39 >= (char)auVar60[0xe]) * cVar39;
                    auVar130[0xf] =
                         (cVar38 < (char)auVar60[0xf]) * auVar60[0xf] |
                         (cVar38 >= (char)auVar60[0xf]) * cVar38;
                    auVar129 = psubsb(auVar60,auVar58);
                    auVar82 = psubsb(auVar143,auVar59);
                    cVar38 = auVar129[0];
                    cVar79 = auVar82[0];
                    auVar145[0] = -(cVar79 < cVar38);
                    cVar43 = auVar129[1];
                    cVar84 = auVar82[1];
                    auVar145[1] = -(cVar84 < cVar43);
                    cVar44 = auVar129[2];
                    cVar87 = auVar82[2];
                    auVar145[2] = -(cVar87 < cVar44);
                    cVar45 = auVar129[3];
                    cVar90 = auVar82[3];
                    auVar145[3] = -(cVar90 < cVar45);
                    cVar46 = auVar129[4];
                    cVar93 = auVar82[4];
                    auVar145[4] = -(cVar93 < cVar46);
                    cVar47 = auVar129[5];
                    cVar96 = auVar82[5];
                    auVar145[5] = -(cVar96 < cVar47);
                    cVar48 = auVar129[6];
                    cVar99 = auVar82[6];
                    auVar145[6] = -(cVar99 < cVar48);
                    cVar49 = auVar129[7];
                    cVar102 = auVar82[7];
                    auVar145[7] = -(cVar102 < cVar49);
                    cVar50 = auVar129[8];
                    cVar105 = auVar82[8];
                    auVar145[8] = -(cVar105 < cVar50);
                    cVar51 = auVar129[9];
                    cVar108 = auVar82[9];
                    auVar145[9] = -(cVar108 < cVar51);
                    cVar52 = auVar129[10];
                    cVar111 = auVar82[10];
                    auVar145[10] = -(cVar111 < cVar52);
                    cVar53 = auVar129[0xb];
                    cVar114 = auVar82[0xb];
                    auVar145[0xb] = -(cVar114 < cVar53);
                    cVar54 = auVar129[0xc];
                    cVar117 = auVar82[0xc];
                    auVar145[0xc] = -(cVar117 < cVar54);
                    cVar55 = auVar129[0xd];
                    cVar120 = auVar82[0xd];
                    auVar145[0xd] = -(cVar120 < cVar55);
                    cVar56 = auVar129[0xe];
                    cVar123 = auVar82[0xe];
                    cVar57 = auVar129[0xf];
                    auVar145[0xe] = -(cVar123 < cVar56);
                    cVar126 = auVar82[0xf];
                    auVar145[0xf] = -(cVar126 < cVar57);
                    auVar129 = pblendvb(auVar144,auVar148,auVar145);
                    auVar143 = pblendvb(auVar40,auVar128,auVar145);
                    auVar144 = paddsb(auVar67,auVar64);
                    auVar131 = paddsb(auVar131,auVar64);
                    auVar145 = pblendvb(auVar144,auVar131,auVar145);
                    auVar82 = psubsb(auVar150,auVar59);
                    cVar80 = auVar82[0];
                    auVar144[0] = -(cVar80 < cVar38);
                    cVar85 = auVar82[1];
                    auVar144[1] = -(cVar85 < cVar43);
                    cVar88 = auVar82[2];
                    auVar144[2] = -(cVar88 < cVar44);
                    cVar91 = auVar82[3];
                    auVar144[3] = -(cVar91 < cVar45);
                    cVar94 = auVar82[4];
                    auVar144[4] = -(cVar94 < cVar46);
                    cVar97 = auVar82[5];
                    auVar144[5] = -(cVar97 < cVar47);
                    cVar100 = auVar82[6];
                    auVar144[6] = -(cVar100 < cVar48);
                    cVar103 = auVar82[7];
                    auVar144[7] = -(cVar103 < cVar49);
                    cVar106 = auVar82[8];
                    auVar144[8] = -(cVar106 < cVar50);
                    cVar109 = auVar82[9];
                    auVar144[9] = -(cVar109 < cVar51);
                    cVar112 = auVar82[10];
                    auVar144[10] = -(cVar112 < cVar52);
                    cVar115 = auVar82[0xb];
                    auVar144[0xb] = -(cVar115 < cVar53);
                    cVar118 = auVar82[0xc];
                    auVar144[0xc] = -(cVar118 < cVar54);
                    cVar121 = auVar82[0xd];
                    auVar144[0xd] = -(cVar121 < cVar55);
                    cVar124 = auVar82[0xe];
                    auVar144[0xe] = -(cVar124 < cVar56);
                    cVar127 = auVar82[0xf];
                    auVar144[0xf] = -(cVar127 < cVar57);
                    auVar133 = pblendvb(auVar133,auVar148,auVar144);
                    cVar39 = auVar148[0];
                    cVar63 = auVar134[0];
                    bVar78 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[1];
                    cVar63 = auVar134[1];
                    bVar68 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[2];
                    cVar63 = auVar134[2];
                    bVar83 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[3];
                    cVar63 = auVar134[3];
                    bVar69 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[4];
                    cVar63 = auVar134[4];
                    bVar86 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[5];
                    cVar63 = auVar134[5];
                    bVar70 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[6];
                    cVar63 = auVar134[6];
                    bVar89 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[7];
                    cVar63 = auVar134[7];
                    bVar71 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[8];
                    cVar63 = auVar134[8];
                    bVar92 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[9];
                    cVar63 = auVar134[9];
                    bVar72 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[10];
                    cVar63 = auVar134[10];
                    bVar95 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[0xb];
                    cVar63 = auVar134[0xb];
                    bVar73 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[0xc];
                    cVar63 = auVar134[0xc];
                    bVar98 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[0xd];
                    cVar63 = auVar134[0xd];
                    bVar74 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[0xe];
                    cVar63 = auVar134[0xe];
                    cVar76 = auVar134[0xf];
                    bVar75 = (cVar63 < cVar39) * cVar39 | (cVar63 >= cVar39) * cVar63;
                    cVar39 = auVar148[0xf];
                    bVar101 = (cVar76 < cVar39) * cVar39 | (cVar76 >= cVar39) * cVar76;
                    auVar134[0] = ((char)bVar104 < (char)bVar78) * bVar78 |
                                  ((char)bVar104 >= (char)bVar78) * bVar104;
                    auVar134[1] = ((char)bVar135 < (char)bVar68) * bVar68 |
                                  ((char)bVar135 >= (char)bVar68) * bVar135;
                    auVar134[2] = ((char)bVar107 < (char)bVar83) * bVar83 |
                                  ((char)bVar107 >= (char)bVar83) * bVar107;
                    auVar134[3] = ((char)bVar136 < (char)bVar69) * bVar69 |
                                  ((char)bVar136 >= (char)bVar69) * bVar136;
                    auVar134[4] = ((char)bVar110 < (char)bVar86) * bVar86 |
                                  ((char)bVar110 >= (char)bVar86) * bVar110;
                    auVar134[5] = ((char)bVar137 < (char)bVar70) * bVar70 |
                                  ((char)bVar137 >= (char)bVar70) * bVar137;
                    auVar134[6] = ((char)bVar113 < (char)bVar89) * bVar89 |
                                  ((char)bVar113 >= (char)bVar89) * bVar113;
                    auVar134[7] = ((char)bVar138 < (char)bVar71) * bVar71 |
                                  ((char)bVar138 >= (char)bVar71) * bVar138;
                    auVar134[8] = ((char)bVar116 < (char)bVar92) * bVar92 |
                                  ((char)bVar116 >= (char)bVar92) * bVar116;
                    auVar134[9] = ((char)bVar139 < (char)bVar72) * bVar72 |
                                  ((char)bVar139 >= (char)bVar72) * bVar139;
                    auVar134[10] = ((char)bVar119 < (char)bVar95) * bVar95 |
                                   ((char)bVar119 >= (char)bVar95) * bVar119;
                    auVar134[0xb] =
                         ((char)bVar140 < (char)bVar73) * bVar73 |
                         ((char)bVar140 >= (char)bVar73) * bVar140;
                    auVar134[0xc] =
                         ((char)bVar122 < (char)bVar98) * bVar98 |
                         ((char)bVar122 >= (char)bVar98) * bVar122;
                    auVar134[0xd] =
                         ((char)bVar141 < (char)bVar74) * bVar74 |
                         ((char)bVar141 >= (char)bVar74) * bVar141;
                    auVar134[0xe] =
                         ((char)bVar142 < (char)bVar75) * bVar75 |
                         ((char)bVar142 >= (char)bVar75) * bVar142;
                    auVar134[0xf] =
                         ((char)bVar125 < (char)bVar101) * bVar101 |
                         ((char)bVar125 >= (char)bVar101) * bVar125;
                    pbVar2 = (byte *)((long)*b_02 + lVar20);
                    *pbVar2 = (cVar38 < cVar79) * cVar79 | (cVar38 >= cVar79) * cVar38;
                    pbVar2[1] = (cVar43 < cVar84) * cVar84 | (cVar43 >= cVar84) * cVar43;
                    pbVar2[2] = (cVar44 < cVar87) * cVar87 | (cVar44 >= cVar87) * cVar44;
                    pbVar2[3] = (cVar45 < cVar90) * cVar90 | (cVar45 >= cVar90) * cVar45;
                    pbVar2[4] = (cVar46 < cVar93) * cVar93 | (cVar46 >= cVar93) * cVar46;
                    pbVar2[5] = (cVar47 < cVar96) * cVar96 | (cVar47 >= cVar96) * cVar47;
                    pbVar2[6] = (cVar48 < cVar99) * cVar99 | (cVar48 >= cVar99) * cVar48;
                    pbVar2[7] = (cVar49 < cVar102) * cVar102 | (cVar49 >= cVar102) * cVar49;
                    pbVar2[8] = (cVar50 < cVar105) * cVar105 | (cVar50 >= cVar105) * cVar50;
                    pbVar2[9] = (cVar51 < cVar108) * cVar108 | (cVar51 >= cVar108) * cVar51;
                    pbVar2[10] = (cVar52 < cVar111) * cVar111 | (cVar52 >= cVar111) * cVar52;
                    pbVar2[0xb] = (cVar53 < cVar114) * cVar114 | (cVar53 >= cVar114) * cVar53;
                    pbVar2[0xc] = (cVar54 < cVar117) * cVar117 | (cVar54 >= cVar117) * cVar54;
                    pbVar2[0xd] = (cVar55 < cVar120) * cVar120 | (cVar55 >= cVar120) * cVar55;
                    pbVar2[0xe] = (cVar56 < cVar123) * cVar123 | (cVar56 >= cVar123) * cVar56;
                    pbVar2[0xf] = (cVar57 < cVar126) * cVar126 | (cVar57 >= cVar126) * cVar57;
                    local_1a8 = auVar129._0_8_;
                    uStack_1a0 = auVar129._8_8_;
                    puVar3 = (undefined8 *)((long)*b_03 + lVar20);
                    *puVar3 = local_1a8;
                    puVar3[1] = uStack_1a0;
                    local_e8 = auVar143._0_8_;
                    uStack_e0 = auVar143._8_8_;
                    puVar3 = (undefined8 *)((long)*b_04 + lVar20);
                    *puVar3 = local_e8;
                    puVar3[1] = uStack_e0;
                    *(undefined1 (*) [16])((long)*b_05 + lVar20) = auVar145;
                    auVar150[0] = (cVar38 < cVar80) * cVar80 | (cVar38 >= cVar80) * cVar38;
                    auVar150[1] = (cVar43 < cVar85) * cVar85 | (cVar43 >= cVar85) * cVar43;
                    auVar150[2] = (cVar44 < cVar88) * cVar88 | (cVar44 >= cVar88) * cVar44;
                    auVar150[3] = (cVar45 < cVar91) * cVar91 | (cVar45 >= cVar91) * cVar45;
                    auVar150[4] = (cVar46 < cVar94) * cVar94 | (cVar46 >= cVar94) * cVar46;
                    auVar150[5] = (cVar47 < cVar97) * cVar97 | (cVar47 >= cVar97) * cVar47;
                    auVar150[6] = (cVar48 < cVar100) * cVar100 | (cVar48 >= cVar100) * cVar48;
                    auVar150[7] = (cVar49 < cVar103) * cVar103 | (cVar49 >= cVar103) * cVar49;
                    auVar150[8] = (cVar50 < cVar106) * cVar106 | (cVar50 >= cVar106) * cVar50;
                    auVar150[9] = (cVar51 < cVar109) * cVar109 | (cVar51 >= cVar109) * cVar51;
                    auVar150[10] = (cVar52 < cVar112) * cVar112 | (cVar52 >= cVar112) * cVar52;
                    auVar150[0xb] = (cVar53 < cVar115) * cVar115 | (cVar53 >= cVar115) * cVar53;
                    auVar150[0xc] = (cVar54 < cVar118) * cVar118 | (cVar54 >= cVar118) * cVar54;
                    auVar150[0xd] = (cVar55 < cVar121) * cVar121 | (cVar55 >= cVar121) * cVar55;
                    auVar150[0xe] = (cVar56 < cVar124) * cVar124 | (cVar56 >= cVar124) * cVar56;
                    auVar150[0xf] = (cVar57 < cVar127) * cVar127 | (cVar57 >= cVar127) * cVar57;
                    auVar66 = pblendvb(auVar66,auVar128,auVar144);
                    auVar64 = paddsb(auVar146,auVar64);
                    auVar146 = pblendvb(auVar64,auVar131,auVar144);
                    auVar64 = *(undefined1 (*) [16])((long)*palVar34 + lVar20);
                    auVar129 = *(undefined1 (*) [16])((long)*palVar35 + lVar20);
                    auVar82 = *(undefined1 (*) [16])((long)*palVar36 + lVar20);
                    auVar131 = *(undefined1 (*) [16])((long)*palVar37 + lVar20);
                    lVar20 = lVar20 + 0x10;
                    auVar145 = auVar130;
                  } while (uVar27 << 4 != lVar20);
                  local_1a8 = local_1e0;
                  if (local_1e4 == iVar22) {
                    palVar19 = palVar15;
                    local_1a8 = palVar18;
                  }
                  iVar22 = 0;
                  do {
                    uVar132 = auVar146._0_8_;
                    auVar146._8_8_ = auVar146._8_8_ << 8 | uVar132 >> 0x38;
                    auVar146._0_8_ = uVar132 << 8 | 0x81;
                    uVar132 = auVar66._0_8_;
                    auVar66._8_8_ = auVar66._8_8_ << 8 | uVar132 >> 0x38;
                    auVar66._0_8_ = uVar132 << 8 | 0x80;
                    uVar132 = auVar133._0_8_;
                    auVar133._8_8_ = auVar133._8_8_ << 8 | uVar132 >> 0x38;
                    auVar133._0_8_ = uVar132 << 8 | 0x80;
                    uVar132 = auVar150._0_8_;
                    auVar150._8_8_ = auVar150._8_8_ << 8 | uVar132 >> 0x38;
                    auVar150._0_8_ = uVar132 << 8 | 0x80;
                    uVar132 = palVar34[uVar21][0];
                    auVar143._8_8_ = palVar34[uVar21][1] << 8 | uVar132 >> 0x38;
                    auVar143._0_8_ = uVar132 << 8 | 0x80;
                    lVar20 = 0;
                    auVar64 = auVar130;
                    do {
                      auVar143 = paddsb(auVar143,*(undefined1 (*) [16])
                                                  ((long)pvVar7 + lVar20 + lVar33));
                      pcVar5 = (char *)((long)*b + lVar20);
                      cVar57 = *pcVar5;
                      cVar63 = pcVar5[1];
                      cVar76 = pcVar5[2];
                      cVar79 = pcVar5[3];
                      cVar80 = pcVar5[4];
                      cVar84 = pcVar5[5];
                      cVar85 = pcVar5[6];
                      cVar87 = pcVar5[7];
                      cVar88 = pcVar5[8];
                      cVar90 = pcVar5[9];
                      cVar91 = pcVar5[10];
                      cVar93 = pcVar5[0xb];
                      cVar94 = pcVar5[0xc];
                      cVar96 = pcVar5[0xd];
                      cVar97 = pcVar5[0xe];
                      cVar99 = pcVar5[0xf];
                      cVar39 = auVar150[0];
                      auVar67[0] = (cVar57 < cVar39) * cVar39 | (cVar57 >= cVar39) * cVar57;
                      cVar38 = auVar150[1];
                      auVar67[1] = (cVar63 < cVar38) * cVar38 | (cVar63 >= cVar38) * cVar63;
                      cVar43 = auVar150[2];
                      auVar67[2] = (cVar76 < cVar43) * cVar43 | (cVar76 >= cVar43) * cVar76;
                      cVar44 = auVar150[3];
                      auVar67[3] = (cVar79 < cVar44) * cVar44 | (cVar79 >= cVar44) * cVar79;
                      cVar45 = auVar150[4];
                      auVar67[4] = (cVar80 < cVar45) * cVar45 | (cVar80 >= cVar45) * cVar80;
                      cVar46 = auVar150[5];
                      auVar67[5] = (cVar84 < cVar46) * cVar46 | (cVar84 >= cVar46) * cVar84;
                      cVar47 = auVar150[6];
                      auVar67[6] = (cVar85 < cVar47) * cVar47 | (cVar85 >= cVar47) * cVar85;
                      cVar48 = auVar150[7];
                      auVar67[7] = (cVar87 < cVar48) * cVar48 | (cVar87 >= cVar48) * cVar87;
                      cVar49 = auVar150[8];
                      auVar67[8] = (cVar88 < cVar49) * cVar49 | (cVar88 >= cVar49) * cVar88;
                      cVar50 = auVar150[9];
                      auVar67[9] = (cVar90 < cVar50) * cVar50 | (cVar90 >= cVar50) * cVar90;
                      cVar51 = auVar150[10];
                      auVar67[10] = (cVar91 < cVar51) * cVar51 | (cVar91 >= cVar51) * cVar91;
                      cVar52 = auVar150[0xb];
                      auVar67[0xb] = (cVar93 < cVar52) * cVar52 | (cVar93 >= cVar52) * cVar93;
                      cVar53 = auVar150[0xc];
                      auVar67[0xc] = (cVar94 < cVar53) * cVar53 | (cVar94 >= cVar53) * cVar94;
                      cVar54 = auVar150[0xd];
                      auVar67[0xd] = (cVar96 < cVar54) * cVar54 | (cVar96 >= cVar54) * cVar96;
                      cVar55 = auVar150[0xe];
                      auVar67[0xe] = (cVar97 < cVar55) * cVar55 | (cVar97 >= cVar55) * cVar97;
                      cVar56 = auVar150[0xf];
                      auVar67[0xf] = (cVar99 < cVar56) * cVar56 | (cVar99 >= cVar56) * cVar99;
                      *(undefined1 (*) [16])((long)*b + lVar20) = auVar67;
                      auVar77[0] = -(auVar67[0] == auVar143[0]);
                      auVar77[1] = -(auVar67[1] == auVar143[1]);
                      auVar77[2] = -(auVar67[2] == auVar143[2]);
                      auVar77[3] = -(auVar67[3] == auVar143[3]);
                      auVar77[4] = -(auVar67[4] == auVar143[4]);
                      auVar77[5] = -(auVar67[5] == auVar143[5]);
                      auVar77[6] = -(auVar67[6] == auVar143[6]);
                      auVar77[7] = -(auVar67[7] == auVar143[7]);
                      auVar77[8] = -(auVar67[8] == auVar143[8]);
                      auVar77[9] = -(auVar67[9] == auVar143[9]);
                      auVar77[10] = -(auVar67[10] == auVar143[10]);
                      auVar77[0xb] = -(auVar67[0xb] == auVar143[0xb]);
                      auVar77[0xc] = -(auVar67[0xc] == auVar143[0xc]);
                      auVar77[0xd] = -(auVar67[0xd] == auVar143[0xd]);
                      auVar77[0xe] = -(auVar67[0xe] == auVar143[0xe]);
                      auVar77[0xf] = -(auVar67[0xf] == auVar143[0xf]);
                      auVar40[0] = -(cVar39 < cVar57);
                      auVar40[1] = -(cVar38 < cVar63);
                      auVar40[2] = -(cVar43 < cVar76);
                      auVar40[3] = -(cVar44 < cVar79);
                      auVar40[4] = -(cVar45 < cVar80);
                      auVar40[5] = -(cVar46 < cVar84);
                      auVar40[6] = -(cVar47 < cVar85);
                      auVar40[7] = -(cVar48 < cVar87);
                      auVar40[8] = -(cVar49 < cVar88);
                      auVar40[9] = -(cVar50 < cVar90);
                      auVar40[10] = -(cVar51 < cVar91);
                      auVar40[0xb] = -(cVar52 < cVar93);
                      auVar40[0xc] = -(cVar53 < cVar94);
                      auVar40[0xd] = -(cVar54 < cVar96);
                      auVar40[0xe] = -(cVar55 < cVar97);
                      auVar40[0xf] = -(cVar56 < cVar99);
                      auVar40 = auVar40 | auVar77;
                      auVar130 = pblendvb(auVar133,*(undefined1 (*) [16])((long)*palVar16 + lVar20),
                                          auVar40);
                      *(undefined1 (*) [16])((long)*palVar16 + lVar20) = auVar130;
                      auVar129 = pblendvb(auVar66,*(undefined1 (*) [16])((long)*b_00 + lVar20),
                                          auVar40);
                      *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar129;
                      auVar82 = pblendvb(auVar146,*(undefined1 (*) [16])((long)*b_01 + lVar20),
                                         auVar40);
                      auVar144 = psubsb(auVar67,auVar58);
                      auVar131 = psubsb(auVar150,auVar59);
                      cVar39 = auVar144[0];
                      cVar57 = auVar131[0];
                      auVar128[0] = -(cVar57 == cVar39);
                      cVar38 = auVar144[1];
                      cVar63 = auVar131[1];
                      auVar128[1] = -(cVar63 == cVar38);
                      cVar43 = auVar144[2];
                      cVar76 = auVar131[2];
                      auVar128[2] = -(cVar76 == cVar43);
                      cVar44 = auVar144[3];
                      cVar79 = auVar131[3];
                      auVar128[3] = -(cVar79 == cVar44);
                      cVar45 = auVar144[4];
                      cVar80 = auVar131[4];
                      auVar128[4] = -(cVar80 == cVar45);
                      cVar46 = auVar144[5];
                      cVar84 = auVar131[5];
                      auVar128[5] = -(cVar84 == cVar46);
                      cVar47 = auVar144[6];
                      cVar85 = auVar131[6];
                      auVar128[6] = -(cVar85 == cVar47);
                      cVar48 = auVar144[7];
                      cVar87 = auVar131[7];
                      auVar128[7] = -(cVar87 == cVar48);
                      cVar49 = auVar144[8];
                      cVar88 = auVar131[8];
                      auVar128[8] = -(cVar88 == cVar49);
                      cVar50 = auVar144[9];
                      cVar90 = auVar131[9];
                      auVar128[9] = -(cVar90 == cVar50);
                      cVar51 = auVar144[10];
                      cVar91 = auVar131[10];
                      auVar128[10] = -(cVar91 == cVar51);
                      cVar52 = auVar144[0xb];
                      cVar93 = auVar131[0xb];
                      auVar128[0xb] = -(cVar93 == cVar52);
                      cVar53 = auVar144[0xc];
                      cVar94 = auVar131[0xc];
                      auVar128[0xc] = -(cVar94 == cVar53);
                      cVar54 = auVar144[0xd];
                      cVar96 = auVar131[0xd];
                      auVar128[0xd] = -(cVar96 == cVar54);
                      cVar55 = auVar144[0xe];
                      cVar97 = auVar131[0xe];
                      cVar99 = auVar131[0xf];
                      auVar128[0xe] = -(cVar97 == cVar55);
                      cVar56 = auVar144[0xf];
                      auVar128[0xf] = -(cVar99 == cVar56);
                      auVar149[0] = -(-0x80 < cVar57);
                      auVar149[1] = -(-0x80 < cVar63);
                      auVar149[2] = -(-0x80 < cVar76);
                      auVar149[3] = -(-0x80 < cVar79);
                      auVar149[4] = -(-0x80 < cVar80);
                      auVar149[5] = -(-0x80 < cVar84);
                      auVar149[6] = -(-0x80 < cVar85);
                      auVar149[7] = -(-0x80 < cVar87);
                      auVar149[8] = -(-0x80 < cVar88);
                      auVar149[9] = -(-0x80 < cVar90);
                      auVar149[10] = -(-0x80 < cVar91);
                      auVar149[0xb] = -(-0x80 < cVar93);
                      auVar149[0xc] = -(-0x80 < cVar94);
                      auVar149[0xd] = -(-0x80 < cVar96);
                      auVar149[0xe] = -(-0x80 < cVar97);
                      auVar149[0xf] = -(-0x80 < cVar99);
                      auVar148[0] = -(cVar39 < cVar57);
                      auVar148[1] = -(cVar38 < cVar63);
                      auVar148[2] = -(cVar43 < cVar76);
                      auVar148[3] = -(cVar44 < cVar79);
                      auVar148[4] = -(cVar45 < cVar80);
                      auVar148[5] = -(cVar46 < cVar84);
                      auVar148[6] = -(cVar47 < cVar85);
                      auVar148[7] = -(cVar48 < cVar87);
                      auVar148[8] = -(cVar49 < cVar88);
                      auVar148[9] = -(cVar50 < cVar90);
                      auVar148[10] = -(cVar51 < cVar91);
                      auVar148[0xb] = -(cVar52 < cVar93);
                      auVar148[0xc] = -(cVar53 < cVar94);
                      auVar148[0xd] = -(cVar54 < cVar96);
                      auVar148[0xe] = -(cVar55 < cVar97);
                      auVar148[0xf] = -(cVar56 < cVar99);
                      auVar148 = auVar149 & auVar128 | auVar148;
                      *(undefined1 (*) [16])((long)*b_01 + lVar20) = auVar82;
                      auVar144 = _DAT_008d0e60;
                      if ((((((((((((((((auVar148 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar148 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar148 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar148 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar148 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar148 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar148 >> 0x37 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar148 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar148 >> 0x47 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar148 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar148 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar148 >> 0x5f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar148 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar148 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar148 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar148[0xf]) {
                        iVar23 = 0x1e;
                      }
                      else {
                        auVar41[0] = -(cVar57 < cVar39);
                        auVar41[1] = -(cVar63 < cVar38);
                        auVar41[2] = -(cVar76 < cVar43);
                        auVar41[3] = -(cVar79 < cVar44);
                        auVar41[4] = -(cVar80 < cVar45);
                        auVar41[5] = -(cVar84 < cVar46);
                        auVar41[6] = -(cVar85 < cVar47);
                        auVar41[7] = -(cVar87 < cVar48);
                        auVar41[8] = -(cVar88 < cVar49);
                        auVar41[9] = -(cVar90 < cVar50);
                        auVar41[10] = -(cVar91 < cVar51);
                        auVar41[0xb] = -(cVar93 < cVar52);
                        auVar41[0xc] = -(cVar94 < cVar53);
                        auVar41[0xd] = -(cVar96 < cVar54);
                        auVar41[0xe] = -(cVar97 < cVar55);
                        auVar41[0xf] = -(cVar99 < cVar56);
                        auVar133 = pblendvb(auVar133,auVar130,auVar41);
                        auVar66 = pblendvb(auVar66,auVar129,auVar41);
                        auVar146 = paddsb(auVar146,_DAT_008d0c20);
                        auVar145 = paddsb(auVar82,_DAT_008d0c20);
                        auVar146 = pblendvb(auVar146,auVar145,auVar41);
                        auVar143 = *(undefined1 (*) [16])((long)*palVar34 + lVar20);
                        iVar23 = 0;
                        auVar150 = auVar131;
                      }
                      cVar39 = auVar130[0];
                      cVar38 = auVar134[0];
                      bVar78 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[1];
                      cVar38 = auVar134[1];
                      bVar68 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[2];
                      cVar38 = auVar134[2];
                      bVar83 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[3];
                      cVar38 = auVar134[3];
                      bVar69 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[4];
                      cVar38 = auVar134[4];
                      bVar86 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[5];
                      cVar38 = auVar134[5];
                      bVar70 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[6];
                      cVar38 = auVar134[6];
                      bVar89 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[7];
                      cVar38 = auVar134[7];
                      bVar71 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[8];
                      cVar38 = auVar134[8];
                      bVar92 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[9];
                      cVar38 = auVar134[9];
                      bVar72 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[10];
                      cVar38 = auVar134[10];
                      bVar95 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[0xb];
                      cVar38 = auVar134[0xb];
                      bVar73 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[0xc];
                      cVar38 = auVar134[0xc];
                      bVar98 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[0xd];
                      cVar38 = auVar134[0xd];
                      bVar74 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[0xe];
                      cVar38 = auVar134[0xe];
                      cVar43 = auVar134[0xf];
                      bVar75 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar130[0xf];
                      bVar101 = (cVar43 < cVar39) * cVar39 | (cVar43 >= cVar39) * cVar43;
                      cVar39 = auVar82[0];
                      cVar38 = auVar129[0];
                      bVar104 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[1];
                      cVar38 = auVar129[1];
                      bVar135 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[2];
                      cVar38 = auVar129[2];
                      bVar107 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[3];
                      cVar38 = auVar129[3];
                      bVar136 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[4];
                      cVar38 = auVar129[4];
                      bVar110 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[5];
                      cVar38 = auVar129[5];
                      bVar137 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[6];
                      cVar38 = auVar129[6];
                      bVar113 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[7];
                      cVar38 = auVar129[7];
                      bVar138 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[8];
                      cVar38 = auVar129[8];
                      bVar116 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[9];
                      cVar38 = auVar129[9];
                      bVar139 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[10];
                      cVar38 = auVar129[10];
                      bVar119 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[0xb];
                      cVar38 = auVar129[0xb];
                      bVar140 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[0xc];
                      cVar38 = auVar129[0xc];
                      bVar122 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[0xd];
                      cVar38 = auVar129[0xd];
                      bVar141 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[0xe];
                      cVar38 = auVar129[0xe];
                      cVar43 = auVar129[0xf];
                      bVar142 = (cVar38 < cVar39) * cVar39 | (cVar38 >= cVar39) * cVar38;
                      cVar39 = auVar82[0xf];
                      bVar125 = (cVar43 < cVar39) * cVar39 | (cVar43 >= cVar39) * cVar43;
                      auVar134[0] = ((char)bVar104 < (char)bVar78) * bVar78 |
                                    ((char)bVar104 >= (char)bVar78) * bVar104;
                      auVar134[1] = ((char)bVar135 < (char)bVar68) * bVar68 |
                                    ((char)bVar135 >= (char)bVar68) * bVar135;
                      auVar134[2] = ((char)bVar107 < (char)bVar83) * bVar83 |
                                    ((char)bVar107 >= (char)bVar83) * bVar107;
                      auVar134[3] = ((char)bVar136 < (char)bVar69) * bVar69 |
                                    ((char)bVar136 >= (char)bVar69) * bVar136;
                      auVar134[4] = ((char)bVar110 < (char)bVar86) * bVar86 |
                                    ((char)bVar110 >= (char)bVar86) * bVar110;
                      auVar134[5] = ((char)bVar137 < (char)bVar70) * bVar70 |
                                    ((char)bVar137 >= (char)bVar70) * bVar137;
                      auVar134[6] = ((char)bVar113 < (char)bVar89) * bVar89 |
                                    ((char)bVar113 >= (char)bVar89) * bVar113;
                      auVar134[7] = ((char)bVar138 < (char)bVar71) * bVar71 |
                                    ((char)bVar138 >= (char)bVar71) * bVar138;
                      auVar134[8] = ((char)bVar116 < (char)bVar92) * bVar92 |
                                    ((char)bVar116 >= (char)bVar92) * bVar116;
                      auVar134[9] = ((char)bVar139 < (char)bVar72) * bVar72 |
                                    ((char)bVar139 >= (char)bVar72) * bVar139;
                      auVar134[10] = ((char)bVar119 < (char)bVar95) * bVar95 |
                                     ((char)bVar119 >= (char)bVar95) * bVar119;
                      auVar134[0xb] =
                           ((char)bVar140 < (char)bVar73) * bVar73 |
                           ((char)bVar140 >= (char)bVar73) * bVar140;
                      auVar134[0xc] =
                           ((char)bVar122 < (char)bVar98) * bVar98 |
                           ((char)bVar122 >= (char)bVar98) * bVar122;
                      auVar134[0xd] =
                           ((char)bVar141 < (char)bVar74) * bVar74 |
                           ((char)bVar141 >= (char)bVar74) * bVar141;
                      auVar134[0xe] =
                           ((char)bVar142 < (char)bVar75) * bVar75 |
                           ((char)bVar142 >= (char)bVar75) * bVar142;
                      auVar134[0xf] =
                           ((char)bVar125 < (char)bVar101) * bVar101 |
                           ((char)bVar125 >= (char)bVar101) * bVar125;
                      cVar39 = auVar64[0];
                      auVar130[0] = (cVar39 < (char)auVar67[0]) * auVar67[0] |
                                    (cVar39 >= (char)auVar67[0]) * cVar39;
                      cVar39 = auVar64[1];
                      auVar130[1] = (cVar39 < (char)auVar67[1]) * auVar67[1] |
                                    (cVar39 >= (char)auVar67[1]) * cVar39;
                      cVar39 = auVar64[2];
                      auVar130[2] = (cVar39 < (char)auVar67[2]) * auVar67[2] |
                                    (cVar39 >= (char)auVar67[2]) * cVar39;
                      cVar39 = auVar64[3];
                      auVar130[3] = (cVar39 < (char)auVar67[3]) * auVar67[3] |
                                    (cVar39 >= (char)auVar67[3]) * cVar39;
                      cVar39 = auVar64[4];
                      auVar130[4] = (cVar39 < (char)auVar67[4]) * auVar67[4] |
                                    (cVar39 >= (char)auVar67[4]) * cVar39;
                      cVar39 = auVar64[5];
                      auVar130[5] = (cVar39 < (char)auVar67[5]) * auVar67[5] |
                                    (cVar39 >= (char)auVar67[5]) * cVar39;
                      cVar39 = auVar64[6];
                      auVar130[6] = (cVar39 < (char)auVar67[6]) * auVar67[6] |
                                    (cVar39 >= (char)auVar67[6]) * cVar39;
                      cVar39 = auVar64[7];
                      auVar130[7] = (cVar39 < (char)auVar67[7]) * auVar67[7] |
                                    (cVar39 >= (char)auVar67[7]) * cVar39;
                      cVar39 = auVar64[8];
                      auVar130[8] = (cVar39 < (char)auVar67[8]) * auVar67[8] |
                                    (cVar39 >= (char)auVar67[8]) * cVar39;
                      cVar39 = auVar64[9];
                      auVar130[9] = (cVar39 < (char)auVar67[9]) * auVar67[9] |
                                    (cVar39 >= (char)auVar67[9]) * cVar39;
                      cVar39 = auVar64[10];
                      auVar130[10] = (cVar39 < (char)auVar67[10]) * auVar67[10] |
                                     (cVar39 >= (char)auVar67[10]) * cVar39;
                      cVar39 = auVar64[0xb];
                      auVar130[0xb] =
                           (cVar39 < (char)auVar67[0xb]) * auVar67[0xb] |
                           (cVar39 >= (char)auVar67[0xb]) * cVar39;
                      cVar39 = auVar64[0xc];
                      auVar130[0xc] =
                           (cVar39 < (char)auVar67[0xc]) * auVar67[0xc] |
                           (cVar39 >= (char)auVar67[0xc]) * cVar39;
                      cVar39 = auVar64[0xd];
                      auVar130[0xd] =
                           (cVar39 < (char)auVar67[0xd]) * auVar67[0xd] |
                           (cVar39 >= (char)auVar67[0xd]) * cVar39;
                      cVar39 = auVar64[0xe];
                      cVar38 = auVar64[0xf];
                      auVar130[0xe] =
                           (cVar39 < (char)auVar67[0xe]) * auVar67[0xe] |
                           (cVar39 >= (char)auVar67[0xe]) * cVar39;
                      auVar130[0xf] =
                           (cVar38 < (char)auVar67[0xf]) * auVar67[0xf] |
                           (cVar38 >= (char)auVar67[0xf]) * cVar38;
                      if ((((((((((((((((auVar148 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar148 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar148 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar148 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar148 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar148 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar148 >> 0x37 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar148 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar148 >> 0x47 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar148 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar148 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar148 >> 0x5f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar148 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar148 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar148 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar148[0xf]) goto LAB_00690310;
                      lVar20 = lVar20 + 0x10;
                      auVar64 = auVar130;
                    } while (uVar27 << 4 != lVar20);
                    iVar23 = 0;
LAB_00690310:
                    if (iVar23 != 0) {
                      if (iVar23 != 0x1e) {
                        bVar11 = false;
                        goto LAB_006903fb;
                      }
                      break;
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != 0x10);
                  auVar42[0] = -(local_78[0] < (char)auVar130[0]);
                  auVar42[1] = -(local_78[1] < (char)auVar130[1]);
                  auVar42[2] = -(local_78[2] < (char)auVar130[2]);
                  auVar42[3] = -(local_78[3] < (char)auVar130[3]);
                  auVar42[4] = -(local_78[4] < (char)auVar130[4]);
                  auVar42[5] = -(local_78[5] < (char)auVar130[5]);
                  auVar42[6] = -(local_78[6] < (char)auVar130[6]);
                  auVar42[7] = -(local_78[7] < (char)auVar130[7]);
                  auVar42[8] = -(local_78[8] < (char)auVar130[8]);
                  auVar42[9] = -(local_78[9] < (char)auVar130[9]);
                  auVar42[10] = -(local_78[10] < (char)auVar130[10]);
                  auVar42[0xb] = -(local_78[0xb] < (char)auVar130[0xb]);
                  auVar42[0xc] = -(local_78[0xc] < (char)auVar130[0xc]);
                  auVar42[0xd] = -(local_78[0xd] < (char)auVar130[0xd]);
                  auVar42[0xe] = -(local_78[0xe] < (char)auVar130[0xe]);
                  auVar42[0xf] = -(local_78[0xf] < (char)auVar130[0xf]);
                  bVar11 = true;
                  if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar42 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar42 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar42 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      local_78[0xf] < (char)auVar130[0xf]) {
                    auVar64 = auVar130 ^ _DAT_008d1360;
                    bVar78 = auVar64[0];
                    bVar68 = auVar64[1];
                    auVar61[0] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[1] = 0;
                    bVar78 = auVar64[2];
                    bVar68 = auVar64[3];
                    auVar61[2] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[3] = 0;
                    bVar78 = auVar64[4];
                    bVar68 = auVar64[5];
                    auVar61[4] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[5] = 0;
                    bVar78 = auVar64[6];
                    bVar68 = auVar64[7];
                    auVar61[6] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[7] = 0;
                    bVar78 = auVar64[8];
                    bVar68 = auVar64[9];
                    auVar61[8] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[9] = 0;
                    bVar78 = auVar64[10];
                    bVar68 = auVar64[0xb];
                    auVar61[10] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[0xb] = 0;
                    bVar78 = auVar64[0xc];
                    bVar68 = auVar64[0xd];
                    auVar61[0xc] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[0xd] = 0;
                    bVar78 = auVar64[0xe];
                    bVar68 = auVar64[0xf];
                    auVar61[0xe] = (bVar78 < bVar68) * bVar78 | (bVar78 >= bVar68) * bVar68;
                    auVar61[0xf] = 0;
                    auVar64 = phminposuw(auVar61);
                    local_1e8 = auVar64._0_4_ ^ 0x7f;
                    if ((char)('~' - local_198) < (char)local_1e8) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      bVar11 = false;
                    }
                    else {
                      bVar78 = ((char)auVar130[8] < (char)auVar130[0]) * auVar130[0] |
                               ((char)auVar130[8] >= (char)auVar130[0]) * auVar130[8];
                      bVar68 = ((char)auVar130[9] < (char)auVar130[1]) * auVar130[1] |
                               ((char)auVar130[9] >= (char)auVar130[1]) * auVar130[9];
                      bVar83 = ((char)auVar130[10] < (char)auVar130[2]) * auVar130[2] |
                               ((char)auVar130[10] >= (char)auVar130[2]) * auVar130[10];
                      bVar69 = ((char)auVar130[0xb] < (char)auVar130[3]) * auVar130[3] |
                               ((char)auVar130[0xb] >= (char)auVar130[3]) * auVar130[0xb];
                      bVar86 = ((char)auVar130[0xc] < (char)auVar130[4]) * auVar130[4] |
                               ((char)auVar130[0xc] >= (char)auVar130[4]) * auVar130[0xc];
                      bVar70 = ((char)auVar130[0xd] < (char)auVar130[5]) * auVar130[5] |
                               ((char)auVar130[0xd] >= (char)auVar130[5]) * auVar130[0xd];
                      bVar89 = ((char)auVar130[0xe] < (char)auVar130[6]) * auVar130[6] |
                               ((char)auVar130[0xe] >= (char)auVar130[6]) * auVar130[0xe];
                      bVar71 = ((char)auVar130[0xf] < (char)auVar130[7]) * auVar130[7] |
                               ((char)auVar130[0xf] >= (char)auVar130[7]) * auVar130[0xf];
                      cVar39 = ('\0' < (char)auVar130[8]) * auVar130[8];
                      cVar44 = ('\0' < (char)auVar130[9]) * auVar130[9];
                      cVar43 = ('\0' < (char)auVar130[10]) * auVar130[10];
                      cVar38 = ('\0' < (char)auVar130[0xb]) * auVar130[0xb];
                      cVar46 = ('\0' < (char)auVar130[0xc]) * auVar130[0xc];
                      cVar45 = ('\0' < (char)auVar130[0xd]) * auVar130[0xd];
                      cVar48 = ('\0' < (char)auVar130[0xe]) * auVar130[0xe];
                      cVar47 = ('\0' < (char)auVar130[0xf]) * auVar130[0xf];
                      bVar78 = ((char)bVar86 < (char)bVar78) * bVar78 |
                               ((char)bVar86 >= (char)bVar78) * bVar86;
                      bVar68 = ((char)bVar70 < (char)bVar68) * bVar68 |
                               ((char)bVar70 >= (char)bVar68) * bVar70;
                      bVar83 = ((char)bVar89 < (char)bVar83) * bVar83 |
                               ((char)bVar89 >= (char)bVar83) * bVar89;
                      bVar69 = ((char)bVar71 < (char)bVar69) * bVar69 |
                               ((char)bVar71 >= (char)bVar69) * bVar71;
                      bVar86 = (cVar39 < (char)bVar86) * bVar86 | (cVar39 >= (char)bVar86) * cVar39;
                      bVar70 = (cVar44 < (char)bVar70) * bVar70 | (cVar44 >= (char)bVar70) * cVar44;
                      bVar89 = (cVar43 < (char)bVar89) * bVar89 | (cVar43 >= (char)bVar89) * cVar43;
                      bVar71 = (cVar38 < (char)bVar71) * bVar71 | (cVar38 >= (char)bVar71) * cVar38;
                      bVar92 = (cVar46 < cVar39) * cVar39 | (cVar46 >= cVar39) * cVar46;
                      bVar72 = (cVar45 < cVar44) * cVar44 | (cVar45 >= cVar44) * cVar45;
                      bVar95 = (cVar48 < cVar43) * cVar43 | (cVar48 >= cVar43) * cVar48;
                      bVar73 = (cVar47 < cVar38) * cVar38 | (cVar47 >= cVar38) * cVar47;
                      cVar46 = ('\0' < cVar46) * cVar46;
                      cVar45 = ('\0' < cVar45) * cVar45;
                      cVar48 = ('\0' < cVar48) * cVar48;
                      cVar47 = ('\0' < cVar47) * cVar47;
                      bVar78 = ((char)bVar83 < (char)bVar78) * bVar78 |
                               ((char)bVar83 >= (char)bVar78) * bVar83;
                      bVar68 = ((char)bVar69 < (char)bVar68) * bVar68 |
                               ((char)bVar69 >= (char)bVar68) * bVar69;
                      bVar83 = ((char)bVar86 < (char)bVar83) * bVar83 |
                               ((char)bVar86 >= (char)bVar83) * bVar86;
                      bVar69 = ((char)bVar70 < (char)bVar69) * bVar69 |
                               ((char)bVar70 >= (char)bVar69) * bVar70;
                      bVar86 = ((char)bVar89 < (char)bVar86) * bVar86 |
                               ((char)bVar89 >= (char)bVar86) * bVar89;
                      bVar70 = ((char)bVar71 < (char)bVar70) * bVar70 |
                               ((char)bVar71 >= (char)bVar70) * bVar71;
                      bVar89 = ((char)bVar92 < (char)bVar89) * bVar89 |
                               ((char)bVar92 >= (char)bVar89) * bVar92;
                      bVar71 = ((char)bVar72 < (char)bVar71) * bVar71 |
                               ((char)bVar72 >= (char)bVar71) * bVar72;
                      bVar92 = ((char)bVar95 < (char)bVar92) * bVar92 |
                               ((char)bVar95 >= (char)bVar92) * bVar95;
                      bVar72 = ((char)bVar73 < (char)bVar72) * bVar72 |
                               ((char)bVar73 >= (char)bVar72) * bVar73;
                      bVar95 = (cVar46 < (char)bVar95) * bVar95 | (cVar46 >= (char)bVar95) * cVar46;
                      bVar73 = (cVar45 < (char)bVar73) * bVar73 | (cVar45 >= (char)bVar73) * cVar45;
                      bVar98 = (cVar48 < cVar46) * cVar46 | (cVar48 >= cVar46) * cVar48;
                      bVar74 = (cVar47 < cVar45) * cVar45 | (cVar47 >= cVar45) * cVar47;
                      cVar48 = ('\0' < cVar48) * cVar48;
                      cVar47 = ('\0' < cVar47) * cVar47;
                      auVar62[0] = ((char)bVar68 < (char)bVar78) * bVar78 |
                                   ((char)bVar68 >= (char)bVar78) * bVar68;
                      auVar62[1] = ((char)bVar83 < (char)bVar68) * bVar68 |
                                   ((char)bVar83 >= (char)bVar68) * bVar83;
                      auVar62[2] = ((char)bVar69 < (char)bVar83) * bVar83 |
                                   ((char)bVar69 >= (char)bVar83) * bVar69;
                      auVar62[3] = ((char)bVar86 < (char)bVar69) * bVar69 |
                                   ((char)bVar86 >= (char)bVar69) * bVar86;
                      auVar62[4] = ((char)bVar70 < (char)bVar86) * bVar86 |
                                   ((char)bVar70 >= (char)bVar86) * bVar70;
                      auVar62[5] = ((char)bVar89 < (char)bVar70) * bVar70 |
                                   ((char)bVar89 >= (char)bVar70) * bVar89;
                      auVar62[6] = ((char)bVar71 < (char)bVar89) * bVar89 |
                                   ((char)bVar71 >= (char)bVar89) * bVar71;
                      auVar62[7] = ((char)bVar92 < (char)bVar71) * bVar71 |
                                   ((char)bVar92 >= (char)bVar71) * bVar92;
                      auVar62[8] = ((char)bVar72 < (char)bVar92) * bVar92 |
                                   ((char)bVar72 >= (char)bVar92) * bVar72;
                      auVar62[9] = ((char)bVar95 < (char)bVar72) * bVar72 |
                                   ((char)bVar95 >= (char)bVar72) * bVar95;
                      auVar62[10] = ((char)bVar73 < (char)bVar95) * bVar95 |
                                    ((char)bVar73 >= (char)bVar95) * bVar73;
                      auVar62[0xb] = ((char)bVar98 < (char)bVar73) * bVar73 |
                                     ((char)bVar98 >= (char)bVar73) * bVar98;
                      auVar62[0xc] = ((char)bVar74 < (char)bVar98) * bVar98 |
                                     ((char)bVar74 >= (char)bVar98) * bVar74;
                      auVar62[0xd] = (cVar48 < (char)bVar74) * bVar74 |
                                     (cVar48 >= (char)bVar74) * cVar48;
                      auVar62[0xe] = (cVar47 < cVar48) * cVar48 | (cVar47 >= cVar48) * cVar47;
                      auVar62[0xf] = ('\0' < cVar47) * cVar47;
                      local_78 = pshufb(auVar62,_DAT_008d0b60);
                      local_1e4 = (int)uVar32;
                      bVar11 = true;
                    }
                  }
LAB_006903fb:
                  local_1d8 = palVar37;
                  if (!bVar11) goto LAB_00690425;
                  uVar32 = uVar32 + 1;
                  palVar17 = palVar35;
                  palVar18 = palVar36;
                  palVar15 = palVar34;
                  local_1e0 = local_1a8;
                  local_1d0 = palVar25;
                } while (uVar32 != iVar4 + 1U);
                uVar32 = (ulong)(iVar4 + 1U);
LAB_00690425:
                if (((char)local_1e8 == '\x7f') ||
                   (auVar58[0] = -(auVar134[0] == 0x7f), auVar58[1] = -(auVar134[1] == 0x7f),
                   auVar58[2] = -(auVar134[2] == 0x7f), auVar58[3] = -(auVar134[3] == 0x7f),
                   auVar58[4] = -(auVar134[4] == 0x7f), auVar58[5] = -(auVar134[5] == 0x7f),
                   auVar58[6] = -(auVar134[6] == 0x7f), auVar58[7] = -(auVar134[7] == 0x7f),
                   auVar58[8] = -(auVar134[8] == 0x7f), auVar58[9] = -(auVar134[9] == 0x7f),
                   auVar58[10] = -(auVar134[10] == 0x7f), auVar58[0xb] = -(auVar134[0xb] == 0x7f),
                   auVar58[0xc] = -(auVar134[0xc] == 0x7f), auVar58[0xd] = -(auVar134[0xd] == 0x7f),
                   auVar58[0xe] = -(auVar134[0xe] == 0x7f), auVar58[0xf] = -(auVar134[0xf] == 0x7f),
                   (((((((((((((((auVar58 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                (auVar58 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar58 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar58 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar58 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar58 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar58 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar58 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar58 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar58 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar58 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar58 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar134[0xf] == 0x7f)) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar22 = parasail_result_is_saturated(result_00);
                palVar17 = palVar35;
                palVar18 = palVar34;
                local_178 = palVar36;
                if (iVar22 == 0) {
                  palVar15 = palVar16;
                  ptr = b;
                  palVar12 = b_01;
                  ptr_00 = palVar19;
                  ptr_01 = palVar25;
                  ptr_02 = local_1a8;
                  ptr_03 = local_1b0;
                  palVar13 = b_00;
                  if ((local_1e4 != (int)uVar32 + -1) &&
                     (palVar15 = palVar25, ptr = palVar19, palVar12 = local_1b0, ptr_00 = b,
                     ptr_01 = palVar16, ptr_02 = b_00, ptr_03 = b_01, palVar13 = local_1a8,
                     local_1e4 == (int)uVar32 + -2)) {
                    palVar17 = palVar25;
                    palVar15 = palVar35;
                    palVar18 = palVar19;
                    ptr = palVar34;
                    palVar12 = palVar37;
                    local_1d8 = local_1b0;
                    local_178 = local_1a8;
                    palVar13 = palVar36;
                  }
                  local_1a8 = palVar13;
                  local_1b0 = palVar12;
                  if ((uVar24 + 0xf & 0x7ffffff0) == 0) {
                    iVar22 = 0;
                    iVar23 = 0;
                    iVar26 = 0;
                  }
                  else {
                    cVar39 = -0x80;
                    uVar27 = 0;
                    cVar38 = -0x80;
                    cVar43 = -0x80;
                    do {
                      if ((*(char *)((long)*ptr + uVar27) == (char)local_1e8) &&
                         (uVar31 = ((uint)uVar27 & 0xf) * uVar10 + ((uint)(uVar27 >> 4) & 0xfffffff)
                         , (int)uVar31 < (int)uVar24)) {
                        cVar39 = *(char *)((long)*palVar15 + uVar27);
                        cVar38 = *(char *)((long)*local_1a8 + uVar27);
                        cVar43 = *(char *)((long)*local_1b0 + uVar27);
                        uVar24 = (ulong)uVar31;
                      }
                      uVar31 = (uint)uVar24;
                      uVar27 = uVar27 + 1;
                    } while ((uVar10 & 0x7ffffff) << 4 != (int)uVar27);
                    iVar26 = cVar39 + 0x80;
                    iVar23 = cVar38 + 0x80;
                    iVar22 = cVar43 + 0x80;
                  }
                  iVar30 = (char)local_1e8 + 0x80;
                }
                else {
                  local_1e4 = 0;
                  iVar22 = 0x80;
                  iVar23 = 0x80;
                  iVar26 = 0x80;
                  iVar30 = 0x80;
                  uVar31 = 0;
                  ptr_00 = b;
                  ptr_01 = palVar16;
                  ptr_02 = b_00;
                  ptr_03 = b_01;
                  palVar15 = palVar25;
                  ptr = palVar19;
                }
                result_00->score = iVar30;
                result_00->end_query = uVar31;
                result_00->end_ref = local_1e4;
                ((result_00->field_4).stats)->matches = iVar26;
                ((result_00->field_4).stats)->similar = iVar23;
                ((result_00->field_4).stats)->length = iVar22;
                parasail_free(local_1b0);
                parasail_free(local_1a8);
                parasail_free(palVar15);
                parasail_free(ptr);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(b_02);
                parasail_free(local_1d8);
                parasail_free(ptr_03);
                parasail_free(local_178);
                parasail_free(ptr_02);
                parasail_free(palVar17);
                parasail_free(ptr_01);
                parasail_free(palVar18);
                parasail_free(ptr_00);
                ppVar29 = result_00;
              }
            }
            goto LAB_0069072c;
          }
          parasail_sw_stats_striped_profile_sse41_128_8_cold_1();
        }
      }
    }
  }
  ppVar29 = (parasail_result_t *)0x0;
LAB_0069072c:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  ppVar29->end_query = iVar14;
  ppVar29->end_ref = iVar4;
  return ppVar29;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse41_128_8(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_8(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse41_128_8(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_8(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_8(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}